

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O0

void __thiscall
sai::Document::IterateSubLayerFiles
          (Document *this,function<bool_(sai::VirtualFileEntry_&)> *SubLayerProc)

{
  bool *__s;
  undefined8 this_00;
  bool bVar1;
  VirtualFileEntry *pVVar2;
  LayerTableEntry LVar3;
  int local_13c;
  undefined1 local_138 [8];
  optional<sai::VirtualFileEntry> SubLayerFile;
  char SubLayerPath [32];
  LayerTableEntry CurSubLayerEntry;
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t SubLayerCount;
  optional<sai::VirtualFileEntry> SubLayerTableFile;
  function<bool_(sai::VirtualFileEntry_&)> *SubLayerProc_local;
  Document *this_local;
  
  SubLayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
  super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
  super__Optional_payload_base<sai::VirtualFileEntry>._104_8_ = SubLayerProc;
  VirtualFileSystem::GetEntry
            ((optional<sai::VirtualFileEntry> *)local_88,&this->super_VirtualFileSystem,"subtbl");
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_88);
  if (bVar1) {
    pVVar2 = std::optional<sai::VirtualFileEntry>::operator->
                       ((optional<sai::VirtualFileEntry> *)local_88);
    local_8c = VirtualFileEntry::Read<unsigned_int>(pVVar2);
    do {
      if (local_8c == 0) break;
      pVVar2 = std::optional<sai::VirtualFileEntry>::operator->
                         ((optional<sai::VirtualFileEntry> *)local_88);
      LVar3 = VirtualFileEntry::Read<sai::LayerTableEntry>(pVVar2);
      SubLayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
      SubLayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._105_7_ = 0;
      __s = &SubLayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
             super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
             super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged;
      snprintf(__s,0x20,"/sublayers/%08x",(ulong)LVar3 & 0xffffffff);
      VirtualFileSystem::GetEntry
                ((optional<sai::VirtualFileEntry> *)local_138,&this->super_VirtualFileSystem,__s);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_138);
      this_00 = SubLayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>.
                _M_payload.super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
                super__Optional_payload_base<sai::VirtualFileEntry>._104_8_;
      if (bVar1) {
        pVVar2 = std::optional<sai::VirtualFileEntry>::operator*
                           ((optional<sai::VirtualFileEntry> *)local_138);
        bVar1 = std::function<bool_(sai::VirtualFileEntry_&)>::operator()
                          ((function<bool_(sai::VirtualFileEntry_&)> *)this_00,pVVar2);
        if (bVar1) goto LAB_00106139;
        local_13c = 3;
      }
      else {
LAB_00106139:
        local_13c = 0;
      }
      std::optional<sai::VirtualFileEntry>::~optional((optional<sai::VirtualFileEntry> *)local_138);
      local_8c = local_8c - 1;
    } while (local_13c == 0);
  }
  std::optional<sai::VirtualFileEntry>::~optional((optional<sai::VirtualFileEntry> *)local_88);
  return;
}

Assistant:

void Document::IterateSubLayerFiles(const std::function<bool(VirtualFileEntry&)>& SubLayerProc)
{
	if( std::optional<VirtualFileEntry> SubLayerTableFile = GetEntry("subtbl"); SubLayerTableFile )
	{
		std::uint32_t SubLayerCount = SubLayerTableFile->Read<std::uint32_t>();
		while( SubLayerCount-- ) // Read each layer entry
		{
			const LayerTableEntry CurSubLayerEntry = SubLayerTableFile->Read<LayerTableEntry>();
			char                  SubLayerPath[32] = {};
			std::snprintf(SubLayerPath, 32u, "/sublayers/%08x", CurSubLayerEntry.Identifier);
			if( std::optional<VirtualFileEntry> SubLayerFile = GetEntry(SubLayerPath);
				SubLayerFile )
			{
				if( !SubLayerProc(*SubLayerFile) )
					break;
			}
		}
	}
}